

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stty.c
# Opt level: O2

sexp_conflict sexp_make_term_attrs_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_conflict psVar1;
  void *pvVar2;
  sexp_conflict res;
  sexp_gc_var_t local_30;
  
  local_30.var = &res;
  res = (sexp_conflict)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  psVar1 = (sexp_conflict)sexp_alloc_tagged_aux(ctx,0x20,(long)(self->value).type.setters >> 1);
  res = psVar1;
  pvVar2 = calloc(1,0x3c);
  (psVar1->value).cpointer.value = pvVar2;
  psVar1->field_0x5 = psVar1->field_0x5 | 2;
  (ctx->value).context.saves = local_30.next;
  return res;
}

Assistant:

sexp sexp_make_term_attrs_stub (sexp ctx, sexp self, sexp_sint_t n) {
  struct termios* r;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_alloc_tagged(ctx, sexp_sizeof(cpointer), sexp_unbox_fixnum(sexp_opcode_return_type(self)));
  sexp_cpointer_value(res) = calloc(1, sizeof(struct termios));
  r = (struct termios*) sexp_cpointer_value(res);
  memset(r, 0, sizeof(struct termios));
  sexp_freep(res) = 1;
  sexp_gc_release1(ctx);
  return res;
}